

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

vector<slang::BufferID,_std::allocator<slang::BufferID>_> * __thiscall
slang::SourceManager::getAllBuffers(SourceManager *this)

{
  ulong uVar1;
  size_type sVar2;
  long in_RSI;
  vector<slang::BufferID,_std::allocator<slang::BufferID>_> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> name;
  size_t i;
  shared_lock<std::shared_mutex> lock;
  vector<slang::BufferID,_std::allocator<slang::BufferID>_> *result;
  mutex_type *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff84;
  BufferID local_34;
  ulong local_30;
  undefined1 local_21;
  
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78
            );
  local_21 = 0;
  std::vector<slang::BufferID,_std::allocator<slang::BufferID>_>::vector
            ((vector<slang::BufferID,_std::allocator<slang::BufferID>_> *)0x32ef04);
  for (local_30 = 1; uVar1 = local_30,
      sVar2 = std::
              vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
              ::size((vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                      *)(in_RSI + 0x70)), uVar1 < sVar2; local_30 = local_30 + 1) {
    in_stack_ffffffffffffff84 = (uint32_t)local_30;
    name = sv((char *)CONCAT44((uint32_t)local_30,in_stack_ffffffffffffff80),
              (size_t)in_stack_ffffffffffffff78);
    BufferID::BufferID(&local_34,in_stack_ffffffffffffff84,name);
    std::vector<slang::BufferID,_std::allocator<slang::BufferID>_>::push_back
              ((vector<slang::BufferID,_std::allocator<slang::BufferID>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (value_type *)in_stack_ffffffffffffff78);
  }
  local_21 = 1;
  std::shared_lock<std::shared_mutex>::~shared_lock
            ((shared_lock<std::shared_mutex> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  return in_RDI;
}

Assistant:

std::vector<BufferID> SourceManager::getAllBuffers() const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    std::vector<BufferID> result;
    for (size_t i = 1; i < bufferEntries.size(); i++)
        result.push_back(BufferID((uint32_t)i, ""sv));

    return result;
}